

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t do_helper_mvc(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src,
                      uintptr_t ra)

{
  ulong uVar1;
  uint8_t uVar2;
  _Bool _Var3;
  uint32_t len;
  int mmu_idx;
  uint32_t offset;
  S390Access local_80;
  S390Access local_58;
  
  uVar1 = (env->psw).mask;
  mmu_idx = 3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      mmu_idx = 0;
      break;
    case 1:
      abort();
    case 2:
      mmu_idx = 1;
      break;
    case 3:
      mmu_idx = 2;
    }
  }
  len = l + 1;
  access_prepare(&local_58,env,src,len,MMU_DATA_LOAD,mmu_idx,ra);
  access_prepare(&local_80,env,dest,len,MMU_DATA_STORE,mmu_idx,ra);
  if (src + 1 == dest) {
    uVar2 = access_get_byte(env,&local_58,0,ra);
    access_memset(env,&local_80,uVar2,ra);
  }
  else {
    _Var3 = is_destructive_overlap(env,dest,src,len);
    if (_Var3) {
      if (len != 0) {
        offset = 0;
        do {
          uVar2 = access_get_byte(env,&local_58,offset,ra);
          access_set_byte(env,&local_80,offset,uVar2,ra);
          offset = offset + 1;
        } while (len != offset);
      }
    }
    else {
      access_memmove(env,&local_80,&local_58,ra);
    }
  }
  return env->cc_op;
}

Assistant:

static uint32_t do_helper_mvc(CPUS390XState *env, uint32_t l, uint64_t dest,
                              uint64_t src, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca, desta;
    uint32_t i;

    HELPER_LOG("%s l %d dest %" PRIx64 " src %" PRIx64 "\n",
               __func__, l, dest, src);

    /* MVC always copies one more byte than specified - maximum is 256 */
    l++;

    srca = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);

    /*
     * "When the operands overlap, the result is obtained as if the operands
     * were processed one byte at a time". Only non-destructive overlaps
     * behave like memmove().
     */
    if (dest == src + 1) {
        access_memset(env, &desta, access_get_byte(env, &srca, 0, ra), ra);
    } else if (!is_destructive_overlap(env, dest, src, l)) {
        access_memmove(env, &desta, &srca, ra);
    } else {
        for (i = 0; i < l; i++) {
            uint8_t byte = access_get_byte(env, &srca, i, ra);

            access_set_byte(env, &desta, i, byte, ra);
        }
    }

    return env->cc_op;
}